

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O3

void __thiscall
cppcms::http::context::submit_to_asynchronous_application
          (context *this,intrusive_ptr<cppcms::application> *app,string *matched)

{
  pointer pcVar1;
  int iVar2;
  undefined4 extraout_var;
  callable<void_()> *pcVar3;
  dispatch_binder bd;
  intrusive_ptr<booster::callable<void_()>_> local_120;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  intrusive_ptr<cppcms::application> local_100;
  undefined1 *local_f8;
  long local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  intrusive_ptr<cppcms::application> local_b0;
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98 [16];
  undefined1 local_88;
  undefined8 local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  intrusive_ptr<cppcms::application> local_60;
  undefined1 *local_58;
  long local_50;
  undefined1 local_48 [16];
  undefined1 local_38;
  
  local_78 = dispatch;
  std::__shared_ptr<cppcms::http::context,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppcms::http::context,void>
            ((__shared_ptr<cppcms::http::context,(__gnu_cxx::_Lock_policy)2> *)&uStack_70,
             (__weak_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2> *)this);
  local_60 = (intrusive_ptr<cppcms::application>)app->p_;
  if (local_60.p_ != (application *)0x0) {
    booster::intrusive_ptr_add_ref(local_60.p_);
  }
  local_58 = local_48;
  pcVar1 = (matched->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + matched->_M_string_length);
  local_38 = 0;
  iVar2 = (*((this->conn_).
             super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_connection[0xc])();
  local_c8 = (undefined4)local_78;
  uStack_c4 = local_78._4_4_;
  uStack_c0 = uStack_70;
  uStack_bc = uStack_6c;
  local_b8 = local_68;
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_68->_M_use_count = local_68->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_68->_M_use_count = local_68->_M_use_count + 1;
    }
  }
  local_b0.p_ = local_60.p_;
  if (local_60.p_ != (application *)0x0) {
    booster::intrusive_ptr_add_ref(local_60.p_);
  }
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char*>((string *)&local_a8,local_58,local_58 + local_50);
  local_88 = local_38;
  pcVar3 = (callable<void_()> *)operator_new(0x58);
  local_118 = local_c8;
  uStack_114 = uStack_c4;
  uStack_110 = uStack_c0;
  uStack_10c = uStack_bc;
  local_108 = local_b8;
  if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_b8->_M_use_count = local_b8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_b8->_M_use_count = local_b8->_M_use_count + 1;
    }
  }
  local_100.p_ = local_b0.p_;
  if (local_b0.p_ != (application *)0x0) {
    booster::intrusive_ptr_add_ref(local_b0.p_);
  }
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_f8,local_a8,local_a8 + local_a0);
  local_d8 = local_88;
  (pcVar3->super_refcounted)._vptr_refcounted = (_func_int **)&PTR__refcounted_00284bd0;
  booster::atomic_counter::atomic_counter(&(pcVar3->super_refcounted).refs_,0);
  (pcVar3->super_refcounted)._vptr_refcounted = (_func_int **)&PTR__callable_impl_00285688;
  *(undefined4 *)&pcVar3[1].super_refcounted._vptr_refcounted = local_118;
  *(undefined4 *)((long)&pcVar3[1].super_refcounted._vptr_refcounted + 4) = uStack_114;
  *(undefined4 *)&pcVar3[1].super_refcounted.refs_ = uStack_110;
  *(undefined4 *)&pcVar3[1].super_refcounted.field_0xc = uStack_10c;
  pcVar3[2].super_refcounted._vptr_refcounted = (_func_int **)local_108;
  if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_108->_M_use_count = local_108->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_108->_M_use_count = local_108->_M_use_count + 1;
    }
  }
  *(application **)&pcVar3[2].super_refcounted.refs_ = local_100.p_;
  if (local_100.p_ != (application *)0x0) {
    booster::intrusive_ptr_add_ref(local_100.p_);
  }
  pcVar3[3].super_refcounted._vptr_refcounted = (_func_int **)(pcVar3 + 4);
  std::__cxx11::string::_M_construct<char*>((string *)(pcVar3 + 3),local_f8,local_f8 + local_f0);
  *(undefined1 *)&pcVar3[5].super_refcounted._vptr_refcounted = local_d8;
  local_120.p_ = pcVar3;
  booster::atomic_counter::inc();
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  booster::intrusive_ptr<cppcms::application>::~intrusive_ptr(&local_100);
  if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108);
  }
  booster::aio::io_service::post((callback *)CONCAT44(extraout_var,iVar2));
  booster::intrusive_ptr<booster::callable<void_()>_>::~intrusive_ptr(&local_120);
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  booster::intrusive_ptr<cppcms::application>::~intrusive_ptr(&local_b0);
  if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  booster::intrusive_ptr<cppcms::application>::~intrusive_ptr(&local_60);
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  return;
}

Assistant:

void context::submit_to_asynchronous_application(booster::intrusive_ptr<application> app,std::string const &matched)
{
	dispatch_binder bd = { &context::dispatch, self(), app,matched,false };
	conn_->get_io_service().post(bd);
}